

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall ON_OBSOLETE_V5_Leader::RemovePoint(ON_OBSOLETE_V5_Leader *this,int idx)

{
  int iVar1;
  bool local_15;
  bool rc;
  int idx_local;
  ON_OBSOLETE_V5_Leader *this_local;
  
  local_15 = true;
  if (idx == -1) {
    ON_SimpleArray<ON_2dPoint>::Remove
              (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>);
  }
  else if ((idx < 0) ||
          (iVar1 = ON_SimpleArray<ON_2dPoint>::Count
                             (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                               super_ON_SimpleArray<ON_2dPoint>), iVar1 <= idx)) {
    local_15 = false;
  }
  else {
    ON_SimpleArray<ON_2dPoint>::Remove
              (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>,
               idx);
  }
  return local_15;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::RemovePoint( int idx )
{
  bool rc = true;
  if( idx == -1)  // -1 removes the last point
  {
    m_points.Remove();
  }
  else if( idx >= 0 && idx < m_points.Count())
  {
    m_points.Remove( idx);
  }
  else
  {
    rc = false;
  }

  return rc;
}